

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bpls.cpp
# Opt level: O0

void adios2::utils::mergeLists(int nV,char **listV,int nA,char **listA,char **mlist,bool *isVar)

{
  int iVar1;
  long in_RCX;
  int in_EDX;
  long in_RSI;
  int in_EDI;
  long in_R8;
  long in_R9;
  int idx;
  int a;
  int v;
  int local_3c;
  int local_38;
  int local_34;
  
  if ((((sortnames & 1) == 0) || ((listattrs & 1) == 0)) || ((attrsonly & 1) != 0)) {
    local_3c = 0;
    if ((attrsonly & 1) == 0) {
      for (local_34 = 0; local_34 < in_EDI; local_34 = local_34 + 1) {
        *(undefined8 *)(in_R8 + (long)local_3c * 8) = *(undefined8 *)(in_RSI + (long)local_34 * 8);
        *(undefined1 *)(in_R9 + local_3c) = 1;
        local_3c = local_3c + 1;
      }
    }
    if ((listattrs & 1) != 0) {
      for (local_38 = 0; local_38 < in_EDX; local_38 = local_38 + 1) {
        *(undefined8 *)(in_R8 + (long)local_3c * 8) = *(undefined8 *)(in_RCX + (long)local_38 * 8);
        *(undefined1 *)(in_R9 + local_3c) = 0;
        local_3c = local_3c + 1;
      }
    }
  }
  else {
    local_34 = 0;
    local_38 = 0;
    while (local_34 < in_EDI || local_38 < in_EDX) {
      if ((local_38 < in_EDX) &&
         ((in_EDI <= local_34 ||
          (iVar1 = strcmp(*(char **)(in_RSI + (long)local_34 * 8),
                          *(char **)(in_RCX + (long)local_38 * 8)), 0 < iVar1)))) {
        *(undefined8 *)(in_R8 + (long)(local_34 + local_38) * 8) =
             *(undefined8 *)(in_RCX + (long)local_38 * 8);
        *(undefined1 *)(in_R9 + (local_34 + local_38)) = 0;
        local_38 = local_38 + 1;
      }
      else {
        *(undefined8 *)(in_R8 + (long)(local_34 + local_38) * 8) =
             *(undefined8 *)(in_RSI + (long)local_34 * 8);
        *(undefined1 *)(in_R9 + (local_34 + local_38)) = 1;
        local_34 = local_34 + 1;
      }
    }
  }
  return;
}

Assistant:

void mergeLists(int nV, char **listV, int nA, char **listA, char **mlist, bool *isVar)
{
    int v, a, idx;
    if (sortnames && listattrs && !attrsonly)
    {
        // merge sort the two lists
        v = 0;
        a = 0;
        while (v < nV || a < nA)
        {
            if (a < nA && (v >= nV || strcmp(listV[v], listA[a]) > 0))
            {
                // fully consumed var list or
                // next item in attr list is less than next item in var list
                mlist[v + a] = listA[a];
                isVar[v + a] = false;
                a++;
            }
            else
            {
                mlist[v + a] = listV[v];
                isVar[v + a] = true;
                v++;
            }
        }
    }
    else
    {
        // first add vars then attrs (if ask ed)
        idx = 0;
        if (!attrsonly)
        {
            for (v = 0; v < nV; v++)
            {
                mlist[idx] = listV[v];
                isVar[idx] = true;
                idx++;
            }
        }
        if (listattrs)
        {
            for (a = 0; a < nA; a++)
            {
                mlist[idx] = listA[a];
                isVar[idx] = false;
                idx++;
            }
        }
    }
}